

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitap.hpp
# Opt level: O0

_Fwd_list_const_iterator<int> __thiscall
burst::algorithm::
bitap<int,std::bitset<32ul>,std::map<int,std::bitset<32ul>,std::less<int>,std::allocator<std::pair<int_const,std::bitset<32ul>>>>>
::dummy_search<std::_Fwd_list_const_iterator<int>>
          (bitap<int,std::bitset<32ul>,std::map<int,std::bitset<32ul>,std::less<int>,std::allocator<std::pair<int_const,std::bitset<32ul>>>>>
           *this,_Fwd_list_const_iterator<int> first,_Fwd_list_const_iterator<int> last,
          bitmask_type *hint)

{
  ulong uVar1;
  bool bVar2;
  size_t sVar3;
  element_type *peVar4;
  reference element;
  bool bVar5;
  _Base_bitset<1UL> local_58;
  _Base_bitset<1UL> local_50;
  _Base_bitset<1UL> local_48;
  _Base_bitset<1UL> local_40;
  ulong local_38;
  size_t dummy_iteration_count;
  bitmask_type *hint_local;
  bitap<int,_std::bitset<32UL>,_std::map<int,_std::bitset<32UL>,_std::less<int>,_std::allocator<std::pair<const_int,_std::bitset<32UL>_>_>_>_>
  *this_local;
  _Fwd_list_const_iterator<int> last_local;
  _Fwd_list_const_iterator<int> first_local;
  
  local_38 = 0;
  dummy_iteration_count = (size_t)hint;
  hint_local = (bitmask_type *)this;
  this_local = (bitap<int,_std::bitset<32UL>,_std::map<int,_std::bitset<32UL>,_std::less<int>,_std::allocator<std::pair<const_int,_std::bitset<32UL>_>_>_>_>
                *)last._M_node;
  last_local._M_node = first._M_node;
  while( true ) {
    bVar2 = std::operator!=(&last_local,(_Self *)&this_local);
    uVar1 = local_38;
    bVar5 = false;
    if (bVar2) {
      peVar4 = std::
               __shared_ptr_access<const_burst::algorithm::detail::element_position_bitmask_table<std::map<int,_std::bitset<32UL>,_std::less<int>,_std::allocator<std::pair<const_int,_std::bitset<32UL>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<const_burst::algorithm::detail::element_position_bitmask_table<std::map<int,_std::bitset<32UL>,_std::less<int>,_std::allocator<std::pair<const_int,_std::bitset<32UL>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      sVar3 = algorithm::detail::
              element_position_bitmask_table<std::map<int,_std::bitset<32UL>,_std::less<int>,_std::allocator<std::pair<const_int,_std::bitset<32UL>_>_>_>_>
              ::length(peVar4);
      bVar5 = uVar1 < sVar3;
    }
    if (!bVar5) break;
    local_50._M_w = *(_WordT *)dummy_iteration_count;
    local_48._M_w =
         (_WordT)bitap<int,_std::bitset<32UL>,_std::map<int,_std::bitset<32UL>,_std::less<int>,_std::allocator<std::pair<const_int,_std::bitset<32UL>_>_>_>_>
                 ::bit_shift(local_50._M_w);
    peVar4 = std::
             __shared_ptr_access<const_burst::algorithm::detail::element_position_bitmask_table<std::map<int,_std::bitset<32UL>,_std::less<int>,_std::allocator<std::pair<const_int,_std::bitset<32UL>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator*((__shared_ptr_access<const_burst::algorithm::detail::element_position_bitmask_table<std::map<int,_std::bitset<32UL>,_std::less<int>,_std::allocator<std::pair<const_int,_std::bitset<32UL>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)this);
    element = std::_Fwd_list_const_iterator<int>::operator*(&last_local);
    local_58._M_w =
         (_WordT)algorithm::detail::
                 element_position_bitmask_table<std::map<int,_std::bitset<32UL>,_std::less<int>,_std::allocator<std::pair<const_int,_std::bitset<32UL>_>_>_>_>
                 ::operator[](peVar4,element);
    local_40._M_w = (_WordT)std::operator&((bitset<32UL> *)&local_48,(bitset<32UL> *)&local_58);
    *(_WordT *)dummy_iteration_count = local_40._M_w;
    std::_Fwd_list_const_iterator<int>::operator++(&last_local);
    local_38 = local_38 + 1;
  }
  return (_Fwd_list_const_iterator<int>)last_local._M_node;
}

Assistant:

ForwardIterator
                dummy_search
                (
                    ForwardIterator first,
                    ForwardIterator last,
                    bitmask_type & hint
                ) const
            {
                auto dummy_iteration_count = std::size_t{0};
                while (first != last && dummy_iteration_count < m_bitmask_table->length())
                {
                    hint = bit_shift(hint) & (*m_bitmask_table)[*first];

                    ++first;
                    ++dummy_iteration_count;
                }

                return first;
            }